

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.h
# Opt level: O2

void __thiscall HighsLinearSumBounds::setNumSums(HighsLinearSumBounds *this,HighsInt numSums)

{
  size_type __new_size;
  
  __new_size = (size_type)numSums;
  std::vector<int,_std::allocator<int>_>::resize(&this->numInfSumLower,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&this->numInfSumUpper,__new_size);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&this->sumLower,__new_size);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&this->sumUpper,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&this->numInfSumLowerOrig,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&this->numInfSumUpperOrig,__new_size);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&this->sumLowerOrig,__new_size);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&this->sumUpperOrig,__new_size);
  return;
}

Assistant:

void setNumSums(HighsInt numSums) {
    numInfSumLower.resize(numSums);
    numInfSumUpper.resize(numSums);
    sumLower.resize(numSums);
    sumUpper.resize(numSums);
    numInfSumLowerOrig.resize(numSums);
    numInfSumUpperOrig.resize(numSums);
    sumLowerOrig.resize(numSums);
    sumUpperOrig.resize(numSums);
  }